

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong local_a0;
  size_t i;
  uint32_t v [16];
  uint32_t m [16];
  uint8_t *in_local;
  blake2s_state *S_local;
  
  for (local_a0 = 0; local_a0 < 0x10; local_a0 = local_a0 + 1) {
    uVar1 = load32(in + local_a0 * 4);
    v[local_a0 + 0xe] = uVar1;
  }
  for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
    v[local_a0 - 2] = S->h[local_a0];
  }
  v[6] = 0x6a09e667;
  v[7] = 0xbb67ae85;
  v[8] = 0x3c6ef372;
  v[9] = 0xa54ff53a;
  v[10] = S->t[0] ^ 0x510e527f;
  v[0xb] = S->t[1] ^ 0x9b05688c;
  v[0xc] = S->f[0] ^ 0x1f83d9ab;
  v[0xd] = S->f[1] ^ 0x5be0cd19;
  uVar2 = (int)i + v[2] + v[0xe];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + v[0xf];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = i._4_4_ + v[3] + m[0];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[1];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[2];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[3];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[4];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[5];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[6];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[7];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[8];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[9];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[10];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[0xb];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[0xc];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[0xd];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[0xc];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[8];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[2];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[6];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[7];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[0xd];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[0xb];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[4];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + v[0xf];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[10];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + v[0xe];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[0];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[9];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[5];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[3];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[1];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[9];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[6];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[10];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + v[0xe];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[3];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[0];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[0xd];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[0xb];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[8];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[0xc];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[1];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[4];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[5];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + v[0xf];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[7];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[2];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[5];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[7];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[1];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + v[0xf];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[0xb];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[10];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[9];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[0xc];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[0];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[4];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[3];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[8];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[2];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + v[0xe];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[0xd];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[6];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[7];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + v[0xe];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[3];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[5];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[0];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[2];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[8];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[0xd];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[0xc];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + v[0xf];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[9];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[10];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[4];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[6];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[1];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[0xb];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[0];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[10];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[4];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[8];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + v[0xe];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[9];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[6];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[1];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[2];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[0xb];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[5];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[3];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[0xd];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[0xc];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + v[0xf];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[7];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[10];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[3];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + v[0xf];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[0xd];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[0xc];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[0xb];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[2];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[8];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + v[0xe];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[5];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[4];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[1];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[7];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[0];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[6];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[9];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[0xb];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[9];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[5];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[0xc];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[10];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + v[0xf];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + m[1];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[7];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[3];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + v[0xe];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[0xd];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[2];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[6];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[4];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[0];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[8];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[4];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[0xd];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[0xc];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[7];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[9];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[1];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + v[0xe];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[6];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[10];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  uVar2 = uVar2 + v[3] + m[0];
  v[0xd] = rotr32(v[0xd] ^ uVar2,8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar3 = uVar3 + v[4] + m[0xb];
  v[10] = rotr32(v[10] ^ uVar3,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  uVar3 = uVar3 + v[4] + m[5];
  v[10] = rotr32(v[10] ^ uVar3,8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + v[0xf];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[2];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[8];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + m[3];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  uVar2 = uVar2 + v[2] + m[8];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],0xc);
  uVar2 = uVar2 + v[2] + m[0];
  v[10] = rotr32(v[10] ^ uVar2,8);
  v[6] = v[6] + v[10];
  v[2] = rotr32(v[2] ^ v[6],7);
  uVar3 = uVar3 + v[3] + m[6];
  v[0xb] = rotr32(v[0xb] ^ uVar3,0x10);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],0xc);
  uVar3 = uVar3 + v[3] + m[2];
  v[0xb] = rotr32(v[0xb] ^ uVar3,8);
  v[7] = v[7] + v[0xb];
  v[3] = rotr32(v[3] ^ v[7],7);
  v[0] = v[0] + v[4] + m[5];
  v[0xc] = rotr32(v[0xc] ^ v[0],0x10);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],0xc);
  v[0] = v[0] + v[4] + m[4];
  v[0xc] = rotr32(v[0xc] ^ v[0],8);
  v[8] = v[8] + v[0xc];
  v[4] = rotr32(v[4] ^ v[8],7);
  v[1] = v[1] + v[5] + v[0xf];
  v[0xd] = rotr32(v[0xd] ^ v[1],0x10);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],0xc);
  v[1] = v[1] + v[5] + m[3];
  v[0xd] = rotr32(v[0xd] ^ v[1],8);
  v[9] = v[9] + v[0xd];
  v[5] = rotr32(v[5] ^ v[9],7);
  uVar2 = uVar2 + v[3] + m[0xd];
  v[0xd] = rotr32(v[0xd] ^ uVar2,0x10);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],0xc);
  v[0xd] = rotr32(v[0xd] ^ uVar2 + v[3] + m[9],8);
  v[8] = v[8] + v[0xd];
  v[3] = rotr32(v[3] ^ v[8],7);
  uVar2 = uVar3 + v[4] + m[7];
  v[10] = rotr32(v[10] ^ uVar2,0x10);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],0xc);
  v[10] = rotr32(v[10] ^ uVar2 + v[4] + m[0xc],8);
  v[9] = v[9] + v[10];
  v[4] = rotr32(v[4] ^ v[9],7);
  v[0] = v[0] + v[5] + m[1];
  v[0xb] = rotr32(v[0xb] ^ v[0],0x10);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],0xc);
  v[0] = v[0] + v[5] + m[10];
  v[0xb] = rotr32(v[0xb] ^ v[0],8);
  v[6] = v[6] + v[0xb];
  v[5] = rotr32(v[5] ^ v[6],7);
  v[1] = v[1] + v[2] + m[0xb];
  v[0xc] = rotr32(v[0xc] ^ v[1],0x10);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],0xc);
  v[1] = v[1] + v[2] + v[0xe];
  v[0xc] = rotr32(v[0xc] ^ v[1],8);
  v[7] = v[7] + v[0xc];
  v[2] = rotr32(v[2] ^ v[7],7);
  for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
    S->h[local_a0] = S->h[local_a0] ^ v[local_a0 - 2] ^ v[local_a0 + 6];
  }
  return;
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}